

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_triplet_to_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *source,size_t pixel_stride_in,unsigned_short *destination,
               size_t pixel_stride,transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  triplet<unsigned_short> tVar4;
  unsigned_long *puVar5;
  anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 local_5e;
  anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 aStack_5c;
  triplet<unsigned_short> color_transformed;
  triplet<unsigned_short> color;
  size_t i;
  triplet<unsigned_short> *type_buffer_in;
  unsigned_long pixel_count;
  uint32_t mask_local;
  transform_hp1<unsigned_short> *transform_local;
  size_t pixel_stride_local;
  unsigned_short *destination_local;
  size_t pixel_stride_in_local;
  triplet<unsigned_short> *source_local;
  
  transform_local = (transform_hp1<unsigned_short> *)pixel_stride;
  pixel_stride_local = (size_t)destination;
  destination_local = (unsigned_short *)pixel_stride_in;
  pixel_stride_in_local = (size_t)source;
  puVar5 = std::min<unsigned_long>
                     ((unsigned_long *)&transform_local,(unsigned_long *)&destination_local);
  sVar3 = pixel_stride_in_local;
  uVar2 = *puVar5;
  for (_color = 0; _color < uVar2; _color = _color + 1) {
    uVar1 = *(uint *)(sVar3 + _color * 6);
    tVar4 = transform_hp1<unsigned_short>::operator()
                      (transform,uVar1 & 0xffff & mask,uVar1 >> 0x10 & mask,
                       *(ushort *)(sVar3 + 4 + _color * 6) & mask);
    local_5e = tVar4.field_0;
    ((anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1 *)(pixel_stride_local + _color * 2))->v1
         = (unsigned_short)local_5e;
    aStack_5c = tVar4.field_1;
    ((anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3 *)
    (pixel_stride_local + (long)(transform_local + _color) * 2))->v2 = (unsigned_short)aStack_5c;
    ((anon_union_2_2_7f9ecb7a_for_triplet<unsigned_short>_5 *)
    (pixel_stride_local + (_color + (long)transform_local * 2) * 2))->v3 =
         (unsigned_short)tVar4.field_2;
  }
  return;
}

Assistant:

void transform_triplet_to_line(const triplet<PixelType>* source, const size_t pixel_stride_in, PixelType* destination,
                               const size_t pixel_stride, Transform& transform, const uint32_t mask) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};
    const triplet<PixelType>* type_buffer_in{source};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const triplet<PixelType> color{type_buffer_in[i]};
        const triplet<PixelType> color_transformed{transform(color.v1 & mask, color.v2 & mask, color.v3 & mask)};

        destination[i] = color_transformed.v1;
        destination[i + pixel_stride] = color_transformed.v2;
        destination[i + 2 * pixel_stride] = color_transformed.v3;
    }
}